

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O1

vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_> * __thiscall
sfc::Palette::subpalettes_matching
          (vector<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>
           *__return_storage_ptr__,Palette *this,Image *image)

{
  Mode to_mode;
  pointer pSVar1;
  pointer puVar2;
  rgba_t rVar3;
  uint uVar4;
  runtime_error *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  rgba_t *color;
  pointer puVar5;
  Subpalette *sp;
  pointer this_01;
  string_view fmt;
  format_args args;
  rgba_vec_t rc;
  rgba_set_t cs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_a8;
  string local_78;
  Subpalette *local_58 [2];
  ulong local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_sfc::Subpalette_*,_std::allocator<const_sfc::Subpalette_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Image::rgba_data((rgba_vec_t *)&local_a8,image);
  to_mode = this->_mode;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_c0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8);
  puVar2 = local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar5 = local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    rVar3 = reduce_color(*puVar5,to_mode);
    *puVar5 = rVar3;
  }
  if ((void *)local_a8._M_impl._0_8_ != (void *)0x0) {
    operator_delete((void *)local_a8._M_impl._0_8_,
                    (long)local_a8._M_impl.super__Rb_tree_header._M_header._M_parent -
                    local_a8._M_impl._0_8_);
  }
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
  set<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>> *)&local_a8,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish);
  if (local_a8._M_impl.super__Rb_tree_header._M_node_count <= this->_max_colors_per_subpalette) {
    this_01 = (this->_subpalettes).
              super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar1 = (this->_subpalettes).
             super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_01 != pSVar1) {
      do {
        uVar4 = Subpalette::diff(this_01,(rgba_set_t *)&local_a8);
        if (uVar4 == 0) {
          local_58[0] = this_01;
          std::vector<sfc::Subpalette_const*,std::allocator<sfc::Subpalette_const*>>::
          emplace_back<sfc::Subpalette_const*>
                    ((vector<sfc::Subpalette_const*,std::allocator<sfc::Subpalette_const*>> *)
                     __return_storage_ptr__,local_58);
        }
        this_01 = this_01 + 1;
      } while (this_01 != pSVar1);
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_a8);
    if (local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_58[0] = (Subpalette *)(ulong)image->_src_coord_x;
  local_48 = (ulong)image->_src_coord_y;
  fmt.size_ = 0x22;
  fmt.data_ = (char *)0x3a;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_58;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_78,(v10 *)"Tile with too many unique colors at {},{} in source image\n",fmt,args
            );
  std::runtime_error::runtime_error(this_00,(string *)&local_78);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<const Subpalette*> Palette::subpalettes_matching(const Image& image) const {
  std::vector<const Subpalette*> sv;

  auto rc = reduce_colors(image.rgba_data(), _mode);
  rgba_set_t cs(rc.begin(), rc.end());

  if (cs.size() > _max_colors_per_subpalette) {
    throw std::runtime_error(
      fmt::format("Tile with too many unique colors at {},{} in source image\n", image.src_coord_x(), image.src_coord_y()));
  }

  for (const Subpalette& sp : _subpalettes) {
    if (sp.diff(cs) == 0)
      sv.push_back(&sp);
  }

  return sv;
}